

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl-x509.c
# Opt level: O1

int lws_x509_verify(lws_x509_cert *x509,lws_x509_cert *trusted,char *common_name)

{
  int iVar1;
  X509_NAME *a;
  char *pcVar2;
  char *__s1;
  char c [32];
  char acStack_48 [32];
  
  if (common_name != (char *)0x0) {
    a = X509_get_subject_name((X509 *)x509->cert);
    if (a == (X509_NAME *)0x0) {
      return -1;
    }
    X509_NAME_oneline(a,acStack_48,0x1e);
    pcVar2 = strstr(acStack_48,"/CN=");
    __s1 = pcVar2 + 4;
    if (pcVar2 == (char *)0x0) {
      __s1 = acStack_48;
    }
    iVar1 = strcmp(__s1,common_name);
    if (iVar1 != 0) {
      _lws_log(1,"%s: common name mismatch\n","lws_x509_verify");
      return -1;
    }
  }
  iVar1 = X509_check_issued((X509 *)trusted->cert,(X509 *)x509->cert);
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else {
    _lws_log(1,"%s: unable to verify cert relationship\n","lws_x509_verify");
    lws_tls_err_describe_clear();
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int
lws_x509_verify(struct lws_x509_cert *x509, struct lws_x509_cert *trusted,
		const char *common_name)
{
	char c[32], *p;
	int ret;

	if (common_name) {
		X509_NAME *xn = X509_get_subject_name(x509->cert);
		if (!xn)
			return -1;
		X509_NAME_oneline(xn, c, (int)sizeof(c) - 2);
		p = strstr(c, "/CN=");
		if (p)
			p = p + 4;
		else
			p = c;

		if (strcmp(p, common_name)) {
			lwsl_err("%s: common name mismatch\n", __func__);
			return -1;
		}
	}

	ret = X509_check_issued(trusted->cert, x509->cert);
	if (ret != X509_V_OK) {
		lwsl_err("%s: unable to verify cert relationship\n", __func__);
		lws_tls_err_describe_clear();

		return -1;
	}

	return 0;
}